

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::NegativeTest2::executeTestCase
          (NegativeTest2 *this,_shader_stage *referencing_stage)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  MessageBuilder local_258;
  uint local_d4;
  undefined1 local_d0 [8];
  string vs_body;
  string te_body;
  string tc_body;
  undefined1 local_60 [8];
  string gs_body;
  string fs_body;
  Functions *gl;
  _shader_stage *referencing_stage_local;
  NegativeTest2 *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  getFragmentShaderBody_abi_cxx11_((string *)((long)&gs_body.field_2 + 8),this,referencing_stage);
  getGeometryShaderBody_abi_cxx11_((string *)local_60,this,referencing_stage);
  getTessellationControlShaderBody_abi_cxx11_
            ((string *)((long)&te_body.field_2 + 8),this,referencing_stage);
  getTessellationEvaluationShaderBody_abi_cxx11_
            ((string *)((long)&vs_body.field_2 + 8),this,referencing_stage);
  getVertexShaderBody_abi_cxx11_((string *)local_d0,this,referencing_stage);
  local_d4 = 0;
  bVar1 = Utils::buildProgram((Functions *)CONCAT44(extraout_var,iVar2),(string *)local_d0,
                              (string *)((long)&te_body.field_2 + 8),
                              (string *)((long)&vs_body.field_2 + 8),(string *)local_60,
                              (string *)((long)&gs_body.field_2 + 8),(GLchar **)0x0,&local_d4,
                              &this->m_vs_id,&this->m_tc_id,&this->m_te_id,&this->m_gs_id,
                              &this->m_fs_id,&this->m_po_id);
  if (bVar1) {
    this_00 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_258,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_258,
                        (char (*) [160])
                        "In the following program, one of the stages references a subroutine that is defined in another stage. This is forbidden by the specification.\n\nVertex shader:\n\n"
                       );
    local_260 = (char *)std::__cxx11::string::c_str();
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_260);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [33])"\n\nTessellation control shader:\n\n");
    local_268 = (char *)std::__cxx11::string::c_str();
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_268);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [36])"\n\nTessellation evaluation shader:\n\n");
    local_270 = (char *)std::__cxx11::string::c_str();
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_270);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])"\n\nGeometry shader:\n\n");
    local_278 = (char *)std::__cxx11::string::c_str();
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_278);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])"\n\nFragment shader:\n\n");
    local_280 = (char *)std::__cxx11::string::c_str();
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_280);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_258);
    this->m_has_test_passed = false;
  }
  deinitGLObjects(this);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(vs_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(te_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(gs_body.field_2._M_local_buf + 8));
  return;
}

Assistant:

void NegativeTest2::executeTestCase(const Utils::_shader_stage& referencing_stage)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const std::string fs_body = getFragmentShaderBody(referencing_stage);
	const std::string gs_body = getGeometryShaderBody(referencing_stage);
	const std::string tc_body = getTessellationControlShaderBody(referencing_stage);
	const std::string te_body = getTessellationEvaluationShaderBody(referencing_stage);
	const std::string vs_body = getVertexShaderBody(referencing_stage);

	if (Utils::buildProgram(gl, vs_body, tc_body, te_body, gs_body, fs_body, NULL, /* xfb_varyings */
							0,													   /* n_xfb_varyings */
							&m_vs_id, &m_tc_id, &m_te_id, &m_gs_id, &m_fs_id, &m_po_id))
	{
		/* Test program should not have built correctly ! */
		m_testCtx.getLog() << tcu::TestLog::Message << "In the following program, one of the stages references "
													   "a subroutine that is defined in another stage. This "
													   "is forbidden by the specification.\n"
													   "\n"
													   "Vertex shader:\n\n"
						   << vs_body.c_str() << "\n\nTessellation control shader:\n\n"
						   << tc_body.c_str() << "\n\nTessellation evaluation shader:\n\n"
						   << te_body.c_str() << "\n\nGeometry shader:\n\n"
						   << gs_body.c_str() << "\n\nFragment shader:\n\n"
						   << fs_body.c_str() << tcu::TestLog::EndMessage;

		m_has_test_passed = false;
	} /* if (test program was built successfully) */

	/* Release the shaders & the program object that buildProgram() created */
	deinitGLObjects();
}